

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O1

void __thiscall MutableBuffer::push(MutableBuffer *this,string *str)

{
  size_t *psVar1;
  pointer __src;
  size_t __n;
  
  __src = (str->_M_dataplus)._M_p;
  __n = str->_M_string_length;
  check_size(this,(this->super_Buffer).size + __n);
  if (__n != 0) {
    memmove((void *)((long)(this->super_Buffer).data + (this->super_Buffer).size),__src,__n);
  }
  psVar1 = &(this->super_Buffer).size;
  *psVar1 = *psVar1 + __n;
  return;
}

Assistant:

void
MutableBuffer::push(const std::string &str) {
  push((const void*)str.c_str(), str.size());
}